

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

size_t __thiscall
TransitionObservationIndependentMADPDiscrete::ConstructJointObservationsRecursively
          (TransitionObservationIndependentMADPDiscrete *this,Index curAgentI,
          JointObservationDiscrete *jo,Index joI)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  size_type sVar4;
  ostream *poVar5;
  E *this_00;
  ostream *poVar6;
  undefined8 uVar7;
  stringstream *psVar8;
  size_t sVar9;
  uint in_ECX;
  stringstream *in_RDX;
  uint in_ESI;
  long *in_RDI;
  ObservationDiscrete *ai;
  JointObservationDiscrete *p_jo;
  JointObservationDiscrete *p_joReceivedArgCopy;
  stringstream ss_1;
  iterator beforelast;
  iterator last;
  iterator it;
  iterator first;
  stringstream ss;
  bool lastAgent;
  stringstream *in_stack_fffffffffffffbe8;
  E *in_stack_fffffffffffffbf0;
  stringstream *__lhs;
  __normal_iterator<ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
  *in_stack_fffffffffffffbf8;
  vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
  *in_stack_fffffffffffffc00;
  ObservationDiscrete *in_stack_fffffffffffffc08;
  JointObservationDiscrete *in_stack_fffffffffffffc10;
  JointObservationDiscrete *in_stack_fffffffffffffc28;
  JointObservationDiscrete *in_stack_fffffffffffffc30;
  stringstream *local_3a0;
  stringstream local_390 [16];
  ostream local_380 [376];
  ObservationDiscrete *local_208;
  ObservationDiscrete *local_200;
  ObservationDiscrete *local_1f8;
  __normal_iterator<ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
  local_1f0;
  ObservationDiscrete *local_1e8;
  undefined1 local_1d9;
  stringstream local_1a8 [16];
  ostream local_198 [372];
  Index in_stack_ffffffffffffffdc;
  uint3 in_stack_ffffffffffffffe0;
  uint uVar10;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar10 = (uint)in_stack_ffffffffffffffe0;
  uVar2 = (ulong)in_ESI;
  lVar3 = (**(code **)(*in_RDI + 0x10))();
  if (uVar2 == lVar3 - 1U) {
    uVar10 = CONCAT13(1,(int3)uVar10);
  }
  uVar2 = (ulong)in_ESI;
  sVar4 = std::
          vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
          ::size((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                  *)(in_RDI + 0x43));
  if (uVar2 < sVar4) {
    std::
    vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                  *)(in_RDI + 0x43),(ulong)in_ESI);
    local_1e8 = (ObservationDiscrete *)
                std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::begin
                          ((vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_> *)
                           in_stack_fffffffffffffbe8);
    std::
    vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                  *)(in_RDI + 0x43),(ulong)in_ESI);
    local_1f0._M_current =
         (ObservationDiscrete *)
         std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::begin
                   ((vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_> *)
                    in_stack_fffffffffffffbe8);
    std::
    vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                  *)(in_RDI + 0x43),(ulong)in_ESI);
    local_1f8 = (ObservationDiscrete *)
                std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::end
                          ((vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_> *)
                           in_stack_fffffffffffffbe8);
    std::
    vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                  *)(in_RDI + 0x43),(ulong)in_ESI);
    local_200 = (ObservationDiscrete *)
                std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::end
                          ((vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_> *)
                           in_stack_fffffffffffffbe8);
    local_208 = (ObservationDiscrete *)
                __gnu_cxx::
                __normal_iterator<ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                ::operator--(in_stack_fffffffffffffbf8,
                             (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                        *)in_stack_fffffffffffffbf0,
                       (__normal_iterator<ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                        *)in_stack_fffffffffffffbe8);
    if (bVar1) {
      std::__cxx11::stringstream::stringstream(local_390);
      poVar5 = std::operator<<(local_380," empty observation set for agent ");
      std::ostream::operator<<(poVar5,in_ESI);
      uVar7 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      __cxa_throw(uVar7,&E::typeinfo,E::~E);
    }
    psVar8 = (stringstream *)operator_new(0x48);
    JointObservationDiscrete::JointObservationDiscrete
              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    __lhs = psVar8;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                               *)__lhs,(__normal_iterator<ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                                        *)in_stack_fffffffffffffbe8), bVar1) {
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                          *)__lhs,(__normal_iterator<ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                                   *)in_stack_fffffffffffffbe8);
      local_3a0 = in_RDX;
      if ((!bVar1) &&
         (bVar1 = __gnu_cxx::operator==
                            ((__normal_iterator<ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                              *)__lhs,(__normal_iterator<ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
                                       *)in_stack_fffffffffffffbe8), local_3a0 = psVar8, !bVar1)) {
        in_stack_fffffffffffffbe8 = (stringstream *)operator_new(0x48);
        JointObservationDiscrete::JointObservationDiscrete
                  (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        local_3a0 = in_stack_fffffffffffffbe8;
      }
      if ((uVar10 & 0x1000000) != 0) {
        DiscreteEntity::SetIndex((DiscreteEntity *)(local_3a0 + 8),in_ECX);
      }
      __gnu_cxx::
      __normal_iterator<ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
      ::operator*(&local_1f0);
      JointObservationDiscrete::AddIndividualObservation
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                 (Index)((ulong)in_stack_fffffffffffffc00 >> 0x20));
      if ((uVar10 & 0x1000000) == 0) {
        sVar9 = ConstructJointObservationsRecursively
                          ((TransitionObservationIndependentMADPDiscrete *)
                           CONCAT44(in_ESI,in_stack_fffffffffffffff0),(Index)((ulong)in_RDX >> 0x20)
                           ,(JointObservationDiscrete *)CONCAT44(in_ECX,uVar10),
                           in_stack_ffffffffffffffdc);
        in_ECX = (uint)sVar9;
      }
      else {
        std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::
        push_back(in_stack_fffffffffffffc00,(value_type *)in_stack_fffffffffffffbf8);
        in_ECX = in_ECX + 1;
      }
      __gnu_cxx::
      __normal_iterator<ObservationDiscrete_*,_std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>
      ::operator++(in_stack_fffffffffffffbf8,(int)((ulong)__lhs >> 0x20));
    }
    return (ulong)in_ECX;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar5 = std::operator<<(local_198,"ConstructJointObservationsRecursively - current Agent index ("
                          );
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_ESI);
  this_00 = (E *)std::operator<<(poVar5,") out of bounds! (_m_indivObs contains ");
  poVar5 = std::operator<<((ostream *)this_00,"observations for ");
  sVar4 = std::
          vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
          ::size((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                  *)(in_RDI + 0x43));
  poVar6 = (ostream *)std::ostream::operator<<(poVar5,sVar4);
  std::operator<<(poVar6," agents...)\n");
  local_1d9 = 1;
  uVar7 = __cxa_allocate_exception(0x28);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  E::E(this_00,(char *)poVar5);
  local_1d9 = 0;
  __cxa_throw(uVar7,&E::typeinfo,E::~E);
}

Assistant:

size_t TransitionObservationIndependentMADPDiscrete::
ConstructJointObservationsRecursively( 
    Index curAgentI, JointObservationDiscrete& jo, Index joI)
{
    bool lastAgent=false;
    if(curAgentI == GetNrAgents()-1)
    {
        lastAgent = true;    
    }    
    if(curAgentI >= _m_indivObs.size())
    {
        stringstream ss;
        ss << "ConstructJointObservationsRecursively - current Agent index ("<<
            curAgentI<<") out of bounds! (_m_indivObs contains "<<
            "observations for "<<_m_indivObs.size() << " agents...)\n";
        throw E(ss.str().c_str());
    }
    ObservationDVec::iterator first = _m_indivObs[curAgentI].begin();
    ObservationDVec::iterator it = _m_indivObs[curAgentI].begin();
    ObservationDVec::iterator last = _m_indivObs[curAgentI].end();
    ObservationDVec::iterator beforelast = _m_indivObs[curAgentI].end();
    beforelast--;

    if(it == last)
    {
        stringstream ss;
            ss << " empty observation set for agent " << curAgentI;
        throw E(ss);
    }
    //first observation extends the received jo 
    JointObservationDiscrete* p_joReceivedArgCopy =
        new JointObservationDiscrete(jo);
    JointObservationDiscrete* p_jo;
        
    while( it != last) // other observations extend duplicates of jo
    {
        if(it == first) //
        {
            p_jo = &jo;
        }
        else if (it == beforelast)//this is the last valid it -> last observation   
        {
            p_jo = p_joReceivedArgCopy; //don't make a new copy
        }
        else //make a new copy
        {        
            p_jo = new JointObservationDiscrete(*p_joReceivedArgCopy);    
        }    
        if(lastAgent)
        {
            p_jo->SetIndex(joI);
            if(DEBUG_CJO)    
                cerr << "setting index of this observation to: "<< joI <<endl;
        }
        ObservationDiscrete* ai = /*(ObservationDiscrete*)*/ &(*it);
        if(DEBUG_CJO)    
            cerr << "Adding agent's indiv. observation to joint observation..."<<endl;
        p_jo->AddIndividualObservation(ai, curAgentI);
        
        if(lastAgent)//jointObservation is now completed:add it to the jointObservation set.
        {
            if(DEBUG_CJO)
            {cerr<<"INSERTING the joint observation:"; p_jo->Print();cerr<<endl;}
            _m_jointObs.push_back(p_jo);
            if(DEBUG_CJO){cerr << "\nINSERTED the joint observation"<<endl<< "_m_jointObservationVec now containts "<< _m_jointObs.size() << " joint actions." << endl;}
            joI++;
        }
        else
            joI = ConstructJointObservationsRecursively(curAgentI+1,*p_jo, joI);
        it++;
    }
    if(DEBUG_CJO)    cerr << ">> TransitionObservationIndependentMADPDiscrete::ConstructJointObservationsRecursively(Index "<<curAgentI<<", JointObservationDiscrete& jo, Index "<< joI<<") FINISHED"<<endl;
    return joI;
    
}